

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.h
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapeTriang>::TPZCompElH1(TPZCompElH1<pzshape::TPZShapeTriang> *this)

{
  TPZSavable *in_RDI;
  TPZManVector<long,_7> *unaff_retaddr;
  void **in_stack_ffffffffffffffe8;
  TPZIntelGen<pzshape::TPZShapeTriang> *in_stack_fffffffffffffff0;
  TPZSavable *size;
  
  size = in_RDI;
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_025127d8);
  TPZIntelGen<pzshape::TPZShapeTriang>::TPZIntelGen
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZCompElH1_025123c0;
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZCompElH1_025123c0;
  TPZManVector<long,_7>::TPZManVector(unaff_retaddr,(int64_t)size,(long *)in_stack_fffffffffffffff0)
  ;
  *(undefined4 *)&in_RDI[0x14]._vptr_TPZSavable = 0;
  return;
}

Assistant:

TPZCompElH1() = default;